

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::UniversalTersePrinter<const_wchar_t_*>::Print(wchar_t *str,ostream *os)

{
  size_t sVar1;
  long in_FS_OFFSET;
  wchar_t *local_48;
  size_t local_40;
  long local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (str == (wchar_t *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
      return;
    }
  }
  else {
    local_48 = (wchar_t *)local_38;
    sVar1 = wcslen(str);
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_48,str,str + sVar1);
    PrintCharsAsStringTo<wchar_t>(local_48,local_40,os);
    if (local_48 != (wchar_t *)local_38) {
      operator_delete(local_48,local_38[0] * 4 + 4);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void Print(const wchar_t* str, ::std::ostream* os) {
    if (str == NULL) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::wstring(str), os);
    }
  }